

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wast-parser.cc
# Opt level: O3

Result wabt::anon_unknown_1::CheckFuncTypeVarMatchesExplicit
                 (Location *loc,Module *module,FuncDeclaration *decl,Errors *errors)

{
  Result RVar1;
  Result RVar2;
  FuncType *pFVar3;
  Enum EVar4;
  Errors *in_R9;
  
  EVar4 = Ok;
  if (decl->has_func_type == true) {
    if ((decl->type_var).type_ != Index) {
      __assert_fail("decl.type_var.is_index()",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/asbish[P]wabt/src/wast-parser.cc"
                    ,0x140,
                    "Result wabt::(anonymous namespace)::CheckFuncTypeVarMatchesExplicit(const Location &, const Module &, const FuncDeclaration &, Errors *)"
                   );
    }
    pFVar3 = Module::GetFuncType(module,&decl->type_var);
    EVar4 = Ok;
    if (pFVar3 != (FuncType *)0x0) {
      RVar1 = CheckTypes(loc,&(decl->sig).result_types,&(pFVar3->sig).result_types,"result",
                         (char *)errors,in_R9);
      RVar2 = CheckTypes(loc,&(decl->sig).param_types,&(pFVar3->sig).param_types,"argument",
                         (char *)errors,in_R9);
      EVar4 = (Enum)(RVar2.enum_ == Error || RVar1.enum_ == Error);
    }
  }
  return (Result)EVar4;
}

Assistant:

Result CheckFuncTypeVarMatchesExplicit(const Location& loc,
                                       const Module& module,
                                       const FuncDeclaration& decl,
                                       Errors* errors) {
  Result result = Result::Ok;
  if (decl.has_func_type) {
    // This should only be run after resolving names.
    assert(decl.type_var.is_index());
    const FuncType* func_type = module.GetFuncType(decl.type_var);
    if (func_type) {
      result |=
          CheckTypes(loc, decl.sig.result_types, func_type->sig.result_types,
                     "function", "result", errors);
      result |=
          CheckTypes(loc, decl.sig.param_types, func_type->sig.param_types,
                     "function", "argument", errors);
    }
  }
  return result;
}